

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ParseDataObjectAnimation(XFileParser *this,Animation *pAnim)

{
  pointer *pppAVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  Logger *this_00;
  AnimBone *banim;
  string objectName;
  AnimBone *local_78;
  string local_70;
  string local_50;
  
  readHeadOfDataObject(this,(string *)0x0);
  local_78 = (AnimBone *)operator_new(0x80);
  (local_78->mBoneName)._M_dataplus._M_p = (pointer)&(local_78->mBoneName).field_2;
  (local_78->mBoneName)._M_string_length = 0;
  (local_78->mBoneName).field_2._M_local_buf[0] = '\0';
  (local_78->mPosKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_78->mPosKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_78->mPosKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_78->mRotKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_78->mRotKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_78->mRotKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_78->mScaleKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_78->mScaleKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_78->mScaleKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_78->mTrafoKeys).
  super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_78->mTrafoKeys).
  super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_78->mTrafoKeys).
  super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position._M_current =
       (pAnim->mAnims).
       super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pAnim->mAnims).
      super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::XFile::AnimBone*,std::allocator<Assimp::XFile::AnimBone*>>::
    _M_realloc_insert<Assimp::XFile::AnimBone*const&>
              ((vector<Assimp::XFile::AnimBone*,std::allocator<Assimp::XFile::AnimBone*>> *)
               &pAnim->mAnims,__position,&local_78);
  }
  else {
    *__position._M_current = local_78;
    pppAVar1 = &(pAnim->mAnims).
                super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  do {
    GetNextToken_abi_cxx11_(&local_50,this);
    if (local_50._M_string_length == 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Unexpected end of file while parsing animation.","");
      ThrowException(this,&local_70);
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar3 == 0) {
        ParseDataObjectAnimationKey(this,local_78);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar3 == 0) {
            GetNextToken_abi_cxx11_(&local_70,this);
            std::__cxx11::string::operator=((string *)local_78,(string *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            CheckForClosingBrace(this);
            goto LAB_00637d86;
          }
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,"Unknown data object in animation in x file");
        }
        ParseUnknownDataObject(this);
      }
    }
LAB_00637d86:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void XFileParser::ParseDataObjectAnimation( Animation* pAnim)
{
    readHeadOfDataObject();
    AnimBone* banim = new AnimBone;
    pAnim->mAnims.push_back( banim);

    bool running = true;
    while( running )
    {
        std::string objectName = GetNextToken();

        if( objectName.length() == 0)
            ThrowException( "Unexpected end of file while parsing animation.");
        else
        if( objectName == "}")
            break; // animation finished
        else
        if( objectName == "AnimationKey")
            ParseDataObjectAnimationKey( banim);
        else
        if( objectName == "AnimationOptions")
            ParseUnknownDataObject(); // not interested
        else
        if( objectName == "{")
        {
            // read frame name
            banim->mBoneName = GetNextToken();
            CheckForClosingBrace();
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in animation in x file");
            ParseUnknownDataObject();
        }
    }
}